

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

int crc_read_many(file *file,png_uint_32 length)

{
  int b;
  png_uint_32 local_20;
  int ch;
  png_uint_32 crc;
  png_uint_32 length_local;
  file *file_local;
  
  if (length != 0) {
    local_20 = file->crc;
    ch = length;
    do {
      b = read_byte(file);
      if (b == -1) {
        return 0;
      }
      local_20 = crc_one_byte(local_20,b);
      ch = ch + -1;
    } while (ch != 0);
    file->crc = local_20;
  }
  return 1;
}

Assistant:

static int
crc_read_many(struct file *file, png_uint_32 length)
   /* Reads 'length' bytes and updates the CRC, returns true on success, false
    * if the input is truncated.
    */
{
   if (length > 0)
   {
      png_uint_32 crc = file->crc;

      do
      {
         int ch = read_byte(file);

         if (ch == EOF)
            return 0; /* Truncated */

         crc = crc_one_byte(crc, ch);
      }
      while (--length > 0);

      file->crc = crc;
   }

   return 1; /* OK */
}